

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_highbd_quantize_sse4.c
# Opt level: O2

void av1_highbd_quantize_fp_sse4_1
               (tran_low_t *coeff_ptr,intptr_t count,int16_t *zbin_ptr,int16_t *round_ptr,
               int16_t *quant_ptr,int16_t *quant_shift_ptr,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,int16_t *scan,
               int16_t *iscan,int log_scale)

{
  uint uVar1;
  undefined1 auVar2 [16];
  int iVar3;
  byte bVar4;
  int iVar5;
  int shift;
  tran_low_t *qAddr;
  longlong *plVar6;
  tran_low_t *dqAddr;
  undefined4 uVar9;
  undefined1 auVar7 [16];
  __m128i alVar8;
  undefined4 uStack_144;
  undefined4 uStack_140;
  __m128i coeff_sign;
  long local_120;
  longlong local_f8;
  longlong lStack_f0;
  __m128i dequant [2];
  __m128i coeff [2];
  __m128i qcoeff [3];
  __m128i qparam [4];
  
  local_f8 = 0;
  lStack_f0 = 0;
  shift = 0x10 - log_scale;
  memset(qcoeff_ptr,0,count * 4);
  memset(dqcoeff_ptr,0,count * 4);
  coeff[0][0] = *(longlong *)coeff_ptr;
  coeff[0][1] = *(longlong *)(coeff_ptr + 2);
  bVar4 = (byte)log_scale;
  iVar3 = (1 << (bVar4 & 0x1f)) >> 1;
  iVar5 = round_ptr[1] + iVar3 >> (bVar4 & 0x1f);
  qparam[0][0] = CONCAT44(iVar5,*round_ptr + iVar3 >> (bVar4 & 0x1f));
  qparam[0][1] = CONCAT44(iVar5,iVar5);
  auVar7 = pmovsxwd(ZEXT416(*(uint *)quant_ptr),ZEXT416(*(uint *)quant_ptr));
  alVar8 = (__m128i)pmovzxdq(auVar7,auVar7);
  uVar1 = *(uint *)dequant_ptr;
  auVar7._8_8_ = (long)(short)(uVar1 >> 0x10);
  auVar7._0_8_ = (long)(short)uVar1;
  qparam[2] = (__m128i)pblendw(auVar7,_DAT_004241a0,0xcc);
  auVar7 = pmovsxwd(ZEXT416(uVar1),ZEXT416(uVar1));
  uVar9 = auVar7._4_4_;
  qparam[3][0] = auVar7._0_8_;
  qparam[3][1]._0_4_ = uVar9;
  qparam[3][1]._4_4_ = uVar9;
  qparam[1] = alVar8;
  quantize_coeff_phase1(coeff,qparam,shift,log_scale,qcoeff,dequant,&coeff_sign);
  qparam[0][0] = CONCAT44(iVar5,iVar5);
  qparam[0][1] = CONCAT44(iVar5,iVar5);
  uStack_144 = alVar8[0]._4_4_;
  uStack_140 = (undefined4)alVar8[1];
  qparam[1][0]._4_4_ = uStack_144;
  qparam[1][0]._0_4_ = uStack_140;
  qparam[1][1]._0_4_ = uStack_140;
  qparam[1][1]._4_4_ = uStack_144;
  qparam[2][0] = (ulong)(uint)((int)uVar1 >> 0x10);
  qparam[2][1]._0_4_ = (int)uVar1 >> 0x10;
  qparam[2][1]._4_4_ = 0;
  qparam[3][0]._4_4_ = uVar9;
  qparam[3][0]._0_4_ = uVar9;
  quantize_coeff_phase2(qcoeff,dequant,&coeff_sign,qparam,shift,log_scale,qcoeff_ptr,dqcoeff_ptr);
  coeff[1][0] = *(longlong *)(coeff_ptr + 4);
  coeff[1][1] = *(longlong *)(coeff_ptr + 6);
  quantize_coeff_phase1(coeff + 1,qparam,shift,log_scale,qcoeff,dequant,&coeff_sign);
  quantize_coeff_phase2
            (qcoeff,dequant,&coeff_sign,qparam,shift,log_scale,qcoeff_ptr + 4,dqcoeff_ptr + 4);
  find_eob(qcoeff_ptr,iscan,(__m128i *)&local_f8);
  dqAddr = dqcoeff_ptr + 0xc;
  qAddr = qcoeff_ptr + 0xc;
  plVar6 = (longlong *)(coeff_ptr + 0xc);
  local_120 = count;
  while (iscan = iscan + 8, 8 < local_120) {
    local_120 = local_120 + -8;
    coeff[0][0] = plVar6[-2];
    coeff[0][1] = plVar6[-1];
    coeff[1][0] = *plVar6;
    coeff[1][1] = plVar6[1];
    quantize_coeff_phase1(coeff,qparam,shift,log_scale,qcoeff,dequant,&coeff_sign);
    quantize_coeff_phase2(qcoeff,dequant,&coeff_sign,qparam,shift,log_scale,qAddr + -4,dqAddr + -4);
    quantize_coeff_phase1(coeff + 1,qparam,shift,log_scale,qcoeff,dequant,&coeff_sign);
    quantize_coeff_phase2(qcoeff,dequant,&coeff_sign,qparam,shift,log_scale,qAddr,dqAddr);
    find_eob(qAddr + -4,iscan,(__m128i *)&local_f8);
    dqAddr = dqAddr + 8;
    qAddr = qAddr + 8;
    plVar6 = plVar6 + 4;
  }
  auVar2._8_8_ = lStack_f0;
  auVar2._0_8_ = local_f8;
  auVar7 = phminposuw(auVar2 ^ _DAT_00468d80);
  *eob_ptr = auVar7._0_2_ ^ 0x7fff;
  return;
}

Assistant:

void av1_highbd_quantize_fp_sse4_1(
    const tran_low_t *coeff_ptr, intptr_t count, const int16_t *zbin_ptr,
    const int16_t *round_ptr, const int16_t *quant_ptr,
    const int16_t *quant_shift_ptr, tran_low_t *qcoeff_ptr,
    tran_low_t *dqcoeff_ptr, const int16_t *dequant_ptr, uint16_t *eob_ptr,
    const int16_t *scan, const int16_t *iscan, int log_scale) {
  __m128i coeff[2], qcoeff[3], dequant[2], qparam[4], coeff_sign;
  __m128i eob = _mm_setzero_si128();
  const tran_low_t *src = coeff_ptr;
  tran_low_t *quanAddr = qcoeff_ptr;
  tran_low_t *dquanAddr = dqcoeff_ptr;
  const int shift = 16 - log_scale;
  const int coeff_stride = 4;
  const int quan_stride = coeff_stride;
  (void)zbin_ptr;
  (void)quant_shift_ptr;
  (void)scan;

  memset(quanAddr, 0, count * sizeof(quanAddr[0]));
  memset(dquanAddr, 0, count * sizeof(dquanAddr[0]));

  coeff[0] = _mm_loadu_si128((__m128i const *)src);
  const int round1 = ROUND_POWER_OF_TWO(round_ptr[1], log_scale);
  const int round0 = ROUND_POWER_OF_TWO(round_ptr[0], log_scale);

  qparam[0] = _mm_set_epi32(round1, round1, round1, round0);
  qparam[1] = _mm_set_epi64x((uint32_t)quant_ptr[1], (uint32_t)quant_ptr[0]);
  qparam[2] =
      _mm_set_epi64x((uint32_t)dequant_ptr[1], (uint32_t)dequant_ptr[0]);
  qparam[3] = _mm_set_epi32(dequant_ptr[1], dequant_ptr[1], dequant_ptr[1],
                            dequant_ptr[0]);

  // DC and first 3 AC
  quantize_coeff_phase1(&coeff[0], qparam, shift, log_scale, qcoeff, dequant,
                        &coeff_sign);

  // update round/quan/dquan for AC
  qparam[0] = _mm_unpackhi_epi64(qparam[0], qparam[0]);
  qparam[1] = _mm_set1_epi64x((uint32_t)quant_ptr[1]);
  qparam[2] = _mm_set1_epi64x((uint32_t)dequant_ptr[1]);
  qparam[3] = _mm_set1_epi32(dequant_ptr[1]);
  quantize_coeff_phase2(qcoeff, dequant, &coeff_sign, qparam, shift, log_scale,
                        quanAddr, dquanAddr);

  // next 4 AC
  coeff[1] = _mm_loadu_si128((__m128i const *)(src + coeff_stride));
  quantize_coeff_phase1(&coeff[1], qparam, shift, log_scale, qcoeff, dequant,
                        &coeff_sign);
  quantize_coeff_phase2(qcoeff, dequant, &coeff_sign, qparam, shift, log_scale,
                        quanAddr + quan_stride, dquanAddr + quan_stride);

  find_eob(quanAddr, iscan, &eob);

  count -= 8;

  // loop for the rest of AC
  while (count > 0) {
    src += coeff_stride << 1;
    quanAddr += quan_stride << 1;
    dquanAddr += quan_stride << 1;
    iscan += quan_stride << 1;

    coeff[0] = _mm_loadu_si128((__m128i const *)src);
    coeff[1] = _mm_loadu_si128((__m128i const *)(src + coeff_stride));

    quantize_coeff_phase1(&coeff[0], qparam, shift, log_scale, qcoeff, dequant,
                          &coeff_sign);
    quantize_coeff_phase2(qcoeff, dequant, &coeff_sign, qparam, shift,
                          log_scale, quanAddr, dquanAddr);

    quantize_coeff_phase1(&coeff[1], qparam, shift, log_scale, qcoeff, dequant,
                          &coeff_sign);
    quantize_coeff_phase2(qcoeff, dequant, &coeff_sign, qparam, shift,
                          log_scale, quanAddr + quan_stride,
                          dquanAddr + quan_stride);

    find_eob(quanAddr, iscan, &eob);

    count -= 8;
  }
  *eob_ptr = get_accumulated_eob(&eob);
}